

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void traverse_tree_sim<PredictionData<double,unsigned_long>,double>
               (WorkerForSimilarity *workspace,
               PredictionData<double,_unsigned_long> *prediction_data,IsoForest *model_outputs,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,size_t curr_tree,bool as_kernel)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  value_type vVar5;
  byte bVar6;
  bool bVar7;
  reference pvVar8;
  unsigned_long *puVar9;
  double *pdVar10;
  reference pvVar11;
  reference pvVar12;
  size_type sVar13;
  IsoForest *in_RCX;
  long lVar14;
  PredictionData<double,_unsigned_long> *in_RDX;
  WorkerForSimilarity *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_R8;
  byte in_R9B;
  double dVar15;
  undefined1 auVar16 [16];
  size_t row_1;
  size_t row;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  size_t orig_end;
  size_t split_ix;
  size_t end_NA;
  size_t st_NA;
  size_t j_3;
  size_t i_3;
  size_t j__2;
  size_t i__2;
  double w_this_1;
  double *rmat_this_1;
  size_t n_group_1;
  size_t j_2;
  size_t i_2;
  double w_this;
  size_t j__1;
  size_t i__1;
  size_t j_1;
  size_t i_1;
  double *rmat_this;
  size_t n_group;
  size_t j;
  size_t i;
  size_t j_;
  size_t i_;
  double rem;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff948;
  anon_class_8_1_57b07335 in_stack_fffffffffffff950;
  undefined4 uVar17;
  undefined4 uVar18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff958;
  undefined4 uVar19;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff960;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff968;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff970;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff978;
  size_t in_stack_fffffffffffff980;
  double *in_stack_fffffffffffff988;
  size_t *in_stack_fffffffffffff990;
  size_t *in_stack_fffffffffffff998;
  pointer *this;
  size_t *in_stack_fffffffffffff9a0;
  size_t *in_stack_fffffffffffff9a8;
  double *in_stack_fffffffffffff9b0;
  double *local_5b8;
  double in_stack_fffffffffffffa80;
  unsigned_long *in_stack_fffffffffffffa88;
  double *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  size_t in_stack_fffffffffffffaa0;
  pointer puVar20;
  size_t in_stack_fffffffffffffaa8;
  pointer puVar21;
  size_t *in_stack_fffffffffffffab0;
  unsigned_long *in_stack_fffffffffffffac0;
  pointer puVar22;
  MissingAction in_stack_fffffffffffffac8;
  pointer puVar23;
  undefined4 in_stack_fffffffffffffad0;
  MissingAction missing_action;
  undefined4 in_stack_fffffffffffffad4;
  NewCategAction NVar24;
  size_t *in_stack_fffffffffffffad8;
  size_t *in_stack_fffffffffffffae0;
  size_type local_3e0;
  size_type local_338;
  double local_2f0;
  double *local_2c0;
  double *local_278;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [152];
  unsigned_long *local_150;
  long local_148;
  pointer local_140;
  pointer local_138;
  value_type local_130;
  ulong local_128;
  size_type local_120;
  unsigned_long *local_110;
  unsigned_long *local_108;
  unsigned_long *local_100;
  unsigned_long *local_f8;
  pointer local_f0;
  pointer local_e8;
  double *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  unsigned_long *local_a0;
  long local_98;
  pointer local_90;
  pointer local_88;
  ulong local_80;
  value_type local_78;
  double local_70;
  unsigned_long *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb8;
  undefined1 uVar25;
  undefined7 in_stack_ffffffffffffffc0;
  
  bVar6 = in_R9B & 1;
  if (interrupt_switch) {
    return;
  }
  if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  bVar7 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff960._M_current
                    );
  if (bVar7) {
    local_50 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff948);
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+(in_stack_fffffffffffff958._M_current,
                     (difference_type)in_stack_fffffffffffff950.workspace);
    local_68 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff948);
    local_60 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffff958._M_current,
                           (difference_type)in_stack_fffffffffffff950.workspace);
    local_58 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffff958._M_current,
                           (difference_type)in_stack_fffffffffffff950.workspace);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (in_RDI,(size_type)
                                in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if (in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= (pointer)*pvVar11) {
      return;
    }
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (in_RDI,(size_type)
                                in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
    if ((pointer)*pvVar11 <
        in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      return;
    }
  }
  pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
  if (pvVar8->tree_left == 0) {
    pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                       ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
    local_70 = pvVar8->remainder;
    bVar7 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff960._M_current);
    if (!bVar7) {
      if ((bVar6 & 1) == 0) {
        if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
          local_100 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff948);
          local_f8 = (unsigned_long *)
                     __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator+(in_stack_fffffffffffff958._M_current,
                                 (difference_type)in_stack_fffffffffffff950.workspace);
          local_110 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff948);
          local_108 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(in_stack_fffffffffffff958._M_current,
                                  (difference_type)in_stack_fffffffffffff950.workspace);
          dVar15 = std::
                   accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double,traverse_tree_sim<PredictionData<double,unsigned_long>,double>(WorkerForSimilarity&,PredictionData<double,unsigned_long>&,IsoForest&,std::vector<IsoTree,std::allocator<IsoTree>>&,unsigned_long,bool)::_lambda(double,unsigned_long)_1_>
                             (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                              (double)in_stack_fffffffffffff948,in_stack_fffffffffffff950);
          local_70 = dVar15 + local_70;
        }
        bVar7 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff960._M_current);
        if (!bVar7) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x433b55);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x433baa);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x433bc3);
          if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
            expected_separation_depth<double>((double)in_stack_fffffffffffff968._M_current);
          }
          increase_comb_counter
                    ((size_t *)in_stack_fffffffffffff970._M_current,
                     (size_t)in_stack_fffffffffffff968._M_current,
                     (size_t)in_stack_fffffffffffff960._M_current,
                     (size_t)in_stack_fffffffffffff958._M_current,
                     (double *)in_stack_fffffffffffff950.workspace,
                     (double *)in_stack_fffffffffffff948,2.17702121789612e-317);
          return;
        }
        bVar7 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff960._M_current);
        if (bVar7) {
          return;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x433c6f);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x433cdb);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x433cf4);
        if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
          expected_separation_depth<double>((double)in_stack_fffffffffffff968._M_current);
        }
        increase_comb_counter_in_groups
                  (in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998,
                   (size_t)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980,in_stack_fffffffffffff978._M_current,
                   in_stack_fffffffffffff9b0,(double)in_stack_fffffffffffff970._M_current);
        return;
      }
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (!bVar7) {
        for (local_138 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_138 <
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_138 = (pointer)((long)local_138 + 1)) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_138);
          local_120 = *pvVar11;
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_120);
          local_130 = *pvVar12;
          local_140 = local_138;
          while (local_140 = (pointer)((long)local_140 + 1),
                local_140 <=
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (in_RDI,(size_type)local_140);
            vVar5 = local_130;
            local_128 = *pvVar11;
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[1].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_128);
            dVar15 = *pvVar12;
            if (local_120 < local_128) {
              sVar13 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_3e0 = (sVar13 + (local_128 - local_120) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_120) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_120)) >> 1);
            }
            else {
              sVar13 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_3e0 = (sVar13 + (local_120 - local_128) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_128) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_128)) >> 1);
            }
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_3e0);
            *pvVar12 = vVar5 * dVar15 + *pvVar12;
          }
        }
        return;
      }
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (bVar7) {
        return;
      }
      local_1e8._144_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff948);
      local_150 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(in_stack_fffffffffffff958._M_current,
                              (difference_type)in_stack_fffffffffffff950.workspace);
      local_1e8._120_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff948);
      local_1e8._128_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff958._M_current,
                       (difference_type)in_stack_fffffffffffff950.workspace);
      local_1e8._96_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff948);
      local_1e8._104_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff958._M_current,
                       (difference_type)in_stack_fffffffffffff950.workspace);
      local_1e8._112_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff958._M_current,
                       (difference_type)in_stack_fffffffffffff950.workspace);
      local_1e8._136_8_ =
           std::
           lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                     ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )in_stack_fffffffffffff978._M_current,
                      (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )in_stack_fffffffffffff970._M_current,
                      (unsigned_long *)in_stack_fffffffffffff968._M_current);
      local_148 = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      for (local_1e8._56_8_ =
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
          (ulong)local_1e8._56_8_ <
          (pointer)((long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + local_148);
          local_1e8._56_8_ = local_1e8._56_8_ + 1) {
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,local_1e8._56_8_);
        local_1e8._72_8_ = *pvVar11;
        local_1e8._88_8_ =
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x434187);
        local_1e8._88_8_ =
             local_1e8._88_8_ +
             local_1e8._72_8_ *
             (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 8;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_1e8._72_8_);
        local_1e8._80_8_ = *pvVar12;
        for (local_1e8._48_8_ =
                  (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + local_148;
            (ulong)local_1e8._48_8_ <=
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_1e8._48_8_ = local_1e8._48_8_ + 1) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,local_1e8._48_8_);
          uVar4 = local_1e8._80_8_;
          local_1e8._64_8_ = *pvVar11;
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_1e8._64_8_);
          lVar14 = local_1e8._64_8_ -
                   (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(double *)(local_1e8._88_8_ + lVar14 * 8) =
               (double)uVar4 * *pvVar12 + *(double *)(local_1e8._88_8_ + lVar14 * 8);
        }
      }
      return;
    }
    if ((bVar6 & 1) != 0) {
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (!bVar7) {
        for (local_88 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            local_88 <
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_88 = (pointer)((long)local_88 + 1)) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_88);
          local_78 = *pvVar11;
          local_90 = local_88;
          while (local_90 = (pointer)((long)local_90 + 1),
                local_90 <=
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (in_RDI,(size_type)local_90);
            local_80 = *pvVar11;
            if (local_78 < local_80) {
              sVar13 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_338 = (sVar13 + (local_80 - local_78) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_78) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_78)) >> 1);
            }
            else {
              sVar13 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_338 = (sVar13 + (local_78 - local_80) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_80) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_80)) >> 1);
            }
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_338);
            *pvVar12 = *pvVar12 + 1.0;
          }
        }
        return;
      }
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (bVar7) {
        return;
      }
      local_a8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff948);
      local_a0 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff958._M_current,
                             (difference_type)in_stack_fffffffffffff950.workspace);
      local_c0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff948);
      local_b8 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff958._M_current,
                             (difference_type)in_stack_fffffffffffff950.workspace);
      local_d8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff948);
      local_d0 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff958._M_current,
                             (difference_type)in_stack_fffffffffffff950.workspace);
      local_c8 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff958._M_current,
                             (difference_type)in_stack_fffffffffffff950.workspace);
      local_b0 = (unsigned_long *)
                 std::
                 lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )in_stack_fffffffffffff978._M_current,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )in_stack_fffffffffffff970._M_current,
                            (unsigned_long *)in_stack_fffffffffffff968._M_current);
      local_98 = std::
                 distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      for (local_e8 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_e8 <
          (pointer)((long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + local_98);
          local_e8 = (pointer)((long)local_e8 + 1)) {
        pdVar10 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x433952);
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_e8);
        local_e0 = pdVar10 + *pvVar11 *
                             (long)in_RDI[5].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (local_f0 = (pointer)((long)in_RDI[1].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_98);
            pdVar10 = local_e0,
            local_f0 <=
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_f0 = (pointer)((long)local_f0 + 1)) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_f0);
          lVar14 = *pvVar11 -
                   (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pdVar10[lVar14] = pdVar10[lVar14] + 1.0;
        }
      }
      return;
    }
    lVar14 = (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (1 - (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    auVar16._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar16._0_8_ = lVar14;
    auVar16._12_4_ = 0x45300000;
    local_70 = (auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0) + local_70;
    bVar7 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff960._M_current);
    if (!bVar7) {
      puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4333f6);
      puVar21 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar20 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar22 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pdVar10 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x43344b);
      if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        local_2f0 = expected_separation_depth<double>((double)in_stack_fffffffffffff968._M_current);
      }
      else {
        local_2f0 = 3.0;
      }
      increase_comb_counter
                (puVar9,(size_t)puVar21,(size_t)puVar20,(size_t)puVar22,pdVar10,local_2f0);
      return;
    }
    bVar7 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff960._M_current);
    if (bVar7) {
      return;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4334ef);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x43355b);
    if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start & 1) == 0) {
      expected_separation_depth<double>((double)in_stack_fffffffffffff968._M_current);
    }
    increase_comb_counter_in_groups
              (in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998,
               (size_t)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               in_stack_fffffffffffff980,in_stack_fffffffffffff978._M_current,
               (double)in_stack_fffffffffffff970._M_current);
    return;
  }
  if ((in_R8 != (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) && ((bVar6 & 1) == 0)) {
    bVar7 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff960._M_current);
    if (bVar7) {
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (!bVar7) {
        bVar7 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff960._M_current);
        if (bVar7) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4344b3);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x43451f);
          increase_comb_counter_in_groups
                    (in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998,
                     (size_t)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                     in_stack_fffffffffffff980,in_stack_fffffffffffff978._M_current,
                     (double)in_stack_fffffffffffff970._M_current);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434569);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x4345d5);
          in_stack_fffffffffffff948 =
               (vector<double,_std::allocator<double>_> *)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x4345ee);
          increase_comb_counter_in_groups
                    (in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998,
                     (size_t)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                     in_stack_fffffffffffff980,in_stack_fffffffffffff978._M_current,
                     in_stack_fffffffffffff9b0,(double)in_stack_fffffffffffff970._M_current);
        }
      }
    }
    else {
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (bVar7) {
        puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434331);
        puVar21 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar20 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar22 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pdVar10 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x434386);
        increase_comb_counter(puVar9,(size_t)puVar21,(size_t)puVar20,(size_t)puVar22,pdVar10,-1.0);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4343c8);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x43441d);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x434436);
        increase_comb_counter
                  ((size_t *)in_stack_fffffffffffff970._M_current,
                   (size_t)in_stack_fffffffffffff968._M_current,
                   (size_t)in_stack_fffffffffffff960._M_current,
                   (size_t)in_stack_fffffffffffff958._M_current,
                   (double *)in_stack_fffffffffffff950.workspace,(double *)in_stack_fffffffffffff948
                   ,2.17805381509593e-317);
      }
    }
  }
  if (((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0) &&
     (bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current), !bVar7)) {
    local_1e8._32_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff948);
    local_1e8._40_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff958._M_current,
                     (difference_type)in_stack_fffffffffffff950.workspace);
    local_1e8._8_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff948);
    local_1e8._16_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff958._M_current,
                     (difference_type)in_stack_fffffffffffff950.workspace);
    local_1e8._24_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff958._M_current,
                     (difference_type)in_stack_fffffffffffff950.workspace);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  }
  pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
  if (pvVar8->col_type == Numeric) {
    if ((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434758);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      in_stack_fffffffffffff948 = (vector<double,_std::allocator<double>_> *)(local_1f8 + 8);
      in_stack_fffffffffffff950.workspace = (WorkerForSimilarity *)local_1f8;
      divide_subset_split<double>
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                 (size_t)in_stack_fffffffffffff978._M_current,
                 (double)in_stack_fffffffffffff970._M_current,
                 (MissingAction)((ulong)in_stack_fffffffffffff968._M_current >> 0x20),
                 in_stack_fffffffffffff960._M_current,in_stack_fffffffffffff9a0,
                 in_stack_fffffffffffff9a8);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434869);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffff950.workspace >> 0x20);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      in_stack_fffffffffffff948 =
           (vector<double,_std::allocator<double>_> *)
           (in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      in_stack_fffffffffffff958._M_current = (unsigned_long *)local_1e8;
      in_stack_fffffffffffff960._M_current = (unsigned_long *)(local_1f8 + 8);
      in_stack_fffffffffffff968._M_current = (double *)local_1f8;
      in_stack_fffffffffffff950.workspace =
           (WorkerForSimilarity *)CONCAT44(uVar17,(int)in_RDX->ncols_numeric);
      divide_subset_split<double,unsigned_long>
                (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                 in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffac8,
                 (size_t *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffad8,in_stack_fffffffffffffae0);
    }
  }
  else if (pvVar8->col_type == Categorical) {
    if (*(int *)&in_RDX->field_0x1c == 0) {
      pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      NVar24 = (NewCategAction)in_stack_fffffffffffff980;
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffff948 >> 0x20);
      uVar19 = (undefined4)((ulong)in_stack_fffffffffffff958._M_current >> 0x20);
      uVar18 = (undefined4)((ulong)in_stack_fffffffffffff950.workspace >> 0x20);
      sVar13 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar8->cat_split);
      if (sVar13 == 0) {
        puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434af8);
        puVar21 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar20 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        sVar3 = pvVar8->col_num;
        puVar22 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar23 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        missing_action = (MissingAction)in_RDX->ncols_numeric;
        NVar24 = *(NewCategAction *)&in_RDX->is_col_major;
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        bVar7 = pvVar8->pct_tree_left <= 0.5 && pvVar8->pct_tree_left != 0.5;
        in_stack_fffffffffffff960._M_current = (unsigned_long *)local_1f8;
        in_stack_fffffffffffff958._M_current = (unsigned_long *)(local_1f8 + 8);
        in_stack_fffffffffffff950.workspace = (WorkerForSimilarity *)local_1e8;
        in_stack_fffffffffffff948 =
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar17,(uint)bVar7);
        divide_subset_split(puVar9,(int *)((long)puVar21 + (long)puVar20 * sVar3 * 4),
                            (size_t)puVar22,(size_t)puVar23,missing_action,NVar24,bVar7,
                            (size_t *)in_stack_fffffffffffff950.workspace,
                            in_stack_fffffffffffff958._M_current,
                            in_stack_fffffffffffff960._M_current);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x434c4f);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<signed_char,_std::allocator<signed_char>_>::data
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x434d04);
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar8->cat_split);
        sVar3 = in_RDX->ncols_numeric;
        uVar1 = *(undefined4 *)&in_RDX->is_col_major;
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        in_stack_fffffffffffff970._M_current = (double *)local_1f8;
        in_stack_fffffffffffff968._M_current = (double *)(local_1f8 + 8);
        in_stack_fffffffffffff960._M_current = (unsigned_long *)local_1e8;
        in_stack_fffffffffffff950.workspace = (WorkerForSimilarity *)CONCAT44(uVar18,uVar1);
        in_stack_fffffffffffff948 =
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar17,(int)sVar3);
        in_stack_fffffffffffff958._M_current =
             (unsigned_long *)
             CONCAT44(uVar19,(uint)(pvVar8->pct_tree_left <= 0.5 && pvVar8->pct_tree_left != 0.5));
        divide_subset_split((size_t *)in_stack_fffffffffffff968._M_current,
                            (int *)in_stack_fffffffffffff960._M_current,
                            (size_t)in_stack_fffffffffffff958._M_current,
                            (size_t)in_stack_fffffffffffff950.workspace,
                            (char *)in_stack_fffffffffffff948,0,
                            (MissingAction)in_stack_fffffffffffff978._M_current,NVar24,false,
                            in_stack_fffffffffffff990,in_stack_fffffffffffff998,
                            in_stack_fffffffffffff9a0);
      }
    }
    else if (*(int *)&in_RDX->field_0x1c == 0x29) {
      puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4349b7);
      puVar21 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      puVar20 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      sVar3 = pvVar8->col_num;
      puVar22 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar23 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      in_stack_fffffffffffff948 = (vector<double,_std::allocator<double>_> *)local_1e8;
      in_stack_fffffffffffff950.workspace = (WorkerForSimilarity *)(local_1f8 + 8);
      in_stack_fffffffffffff958._M_current = (unsigned_long *)local_1f8;
      divide_subset_split(puVar9,(int *)((long)puVar21 + (long)puVar20 * sVar3 * 4),(size_t)puVar22,
                          (size_t)puVar23,pvVar8->chosen_cat,(MissingAction)in_RDX->ncols_numeric,
                          (size_t *)in_stack_fffffffffffff948,
                          (size_t *)in_stack_fffffffffffff950.workspace,
                          in_stack_fffffffffffff958._M_current);
    }
  }
  uVar25 = (undefined1)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38);
  pdVar10 = (double *)
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((*(int *)&in_RDX->is_col_major == 0) && (*(int *)&in_RDX->field_0x1c == 0)) &&
     ((in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0)) {
    if (((int)in_RDX->ncols_numeric == 0) &&
       (pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8),
       pvVar8->col_type == Numeric)) {
      local_1e8._0_8_ = local_1f8._0_8_;
      local_1f8._8_8_ = local_1f8._0_8_;
    }
LAB_004350a6:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4350b3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4350c0);
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_1f8._8_8_) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff948);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff948);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffff958._M_current,
                (difference_type)in_stack_fffffffffffff950.workspace);
      std::vector<double,std::allocator<double>>::
      assign<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff960._M_current,
                 in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff948)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff948)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_fffffffffffff958._M_current,
                  (difference_type)in_stack_fffffffffffff950.workspace);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff960._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffff970._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffff968._M_current);
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_1f8._8_8_) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_1f8._8_8_ + -1);
      for (local_278 = (double *)local_1e8._0_8_; local_278 < (ulong)local_1f8._8_8_;
          local_278 = (double *)((long)local_278 + 1)) {
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        dVar15 = pvVar8->pct_tree_left;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_278);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar11);
        *pvVar12 = dVar15 * *pvVar12;
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar6,in_stack_ffffffffffffffc0),
                 SUB81((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38,0));
    }
    if ((ulong)local_1e8._0_8_ <= pdVar10) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1e8._0_8_;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pdVar10;
      bVar7 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff960._M_current);
      if (!bVar7) {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff948);
        std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffff948);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff948);
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff948);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff948);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff948);
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff978._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff970._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff968._M_current);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x4354a1);
        std::vector<double,_std::allocator<double>_>::shrink_to_fit
                  ((vector<double,_std::allocator<double>_> *)0x4354ab);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4354bf);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4354c9);
      }
      for (local_2c0 = (double *)local_1e8._0_8_;
          uVar25 = (undefined1)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38),
          local_2c0 < (ulong)local_1f8._8_8_; local_2c0 = (double *)((long)local_2c0 + 1)) {
        pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        dVar15 = 1.0 - pvVar8->pct_tree_left;
        this = &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_2c0);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)this,*pvVar11);
        *pvVar12 = dVar15 * *pvVar12;
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar6,in_stack_ffffffffffffffc0),(bool)uVar25);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff960._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff960._M_current);
  }
  else {
    iVar2 = (int)in_RDX->ncols_numeric;
    if (iVar2 != 0) {
      if (iVar2 == 0x15) goto LAB_004350a6;
      if (iVar2 != 0x16) {
        return;
      }
      pvVar8 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      if (pvVar8->pct_tree_left < 0.5) {
        local_5b8 = (double *)local_1e8._0_8_;
      }
      else {
        local_5b8 = (double *)local_1f8._8_8_;
      }
      local_1f8._0_8_ = local_5b8;
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_1f8._0_8_) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_1f8._0_8_ + -1);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar6,in_stack_ffffffffffffffc0),(bool)uVar25);
    }
    if ((ulong)local_1f8._0_8_ <= pdVar10) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1f8._0_8_;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pdVar10;
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar6,in_stack_ffffffffffffffc0),(bool)uVar25);
    }
  }
  return;
}

Assistant:

void traverse_tree_sim(WorkerForSimilarity   &workspace,
                       PredictionData        &prediction_data,
                       IsoForest             &model_outputs,
                       std::vector<IsoTree>  &trees,
                       size_t                curr_tree,
                       const bool            as_kernel)
{
    if (interrupt_switch)
        return;

    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (trees[curr_tree].tree_left == 0)
    {
        ldouble_safe rem = (ldouble_safe) trees[curr_tree].remainder;
        if (workspace.weights_arr.empty())
        {
            if (!as_kernel)
            {
                rem += (ldouble_safe)(workspace.end - workspace.st + 1);
                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows, workspace.rmat.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                        }
                    }
                }
            }
        }

        else
        {
            if (!as_kernel)
            {
                if (!workspace.assume_full_distr)
                {
                    rem += std::accumulate(workspace.ix_arr.begin() + workspace.st,
                                           workspace.ix_arr.begin() + workspace.end,
                                           (ldouble_safe) 0.,
                                           [&workspace](ldouble_safe curr, size_t ix)
                                           {return curr + (ldouble_safe)workspace.weights_arr[ix];}
                                          );
                }

                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.weights_arr.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows,
                                                    workspace.rmat.data(), workspace.weights_arr.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    double w_this;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    double w_this;
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        rmat_this = workspace.rmat.data() + i_*workspace.n_from;
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            rmat_this[j_ - workspace.n_from]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(), -1.);
            else
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.weights_arr.data(), -1.);
        }
        else if (!workspace.rmat.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows, workspace.rmat.data(), -1.);
            else
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows,
                                                workspace.rmat.data(), workspace.weights_arr.data(), -1.);
        }
    }


    /* divide according to tree */
    if (prediction_data.Xc_indptr != NULL && !workspace.tmat_sep.empty())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            if (prediction_data.Xc_indptr == NULL)
                divide_subset_split(workspace.ix_arr.data(),
                                    prediction_data.numeric_data + prediction_data.nrows * trees[curr_tree].col_num,
                                    workspace.st, workspace.end, trees[curr_tree].num_split,
                                    model_outputs.missing_action, st_NA, end_NA, split_ix);
            else
                divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    trees[curr_tree].num_split, model_outputs.missing_action,
                                    st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch(model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }


    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL) {
        if (model_outputs.missing_action == Fail && trees[curr_tree].col_type == Numeric) {
            st_NA = split_ix;
            end_NA = split_ix;
        }
        goto missing_action_divide;
    }
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }

        case Divide: /* new_cat_action = 'Weighted' will also fall here */
        {
            /* TODO: this one should also have a parameter 'changed_weoghts' like during fitting */
            missing_action_divide:
          /* TODO: maybe here it shouldn't copy the whole ix_arr,
             but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.begin(),
                              workspace.ix_arr.begin() + end_NA);
            }

            if (end_NA > workspace.st)
            {
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }

            if (st_NA <= orig_end)
            {
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (!weights_arr.empty())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }
    }
}